

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  char *__s;
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  FileError *__return_storage_ptr__;
  error_code ec;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  error_code local_98;
  string local_88;
  path local_68;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __s = (config_file->_M_dataplus)._M_p;
  local_98._M_value = 0;
  local_98._M_cat = (error_category *)::std::_V2::system_category();
  local_40._M_len = strlen(__s);
  local_40._M_str = __s;
  ::std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_68,&local_40,auto_format);
  cVar2 = ::std::filesystem::status(&local_68,&local_98);
  std::filesystem::__cxx11::path::~path(&local_68);
  if ((((local_98._M_value == 0) && (cVar2 != '\0')) && (cVar2 != '\x02')) && (cVar2 != -1)) {
    Config::from_file((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)&local_68,
                      (this->config_formatter_).
                      super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,config_file
                     );
    _parse_config(this,(vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)&local_68);
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)&local_68);
    bVar3 = true;
  }
  else {
    if (throw_error) {
      __return_storage_ptr__ = (FileError *)__cxa_allocate_exception(0x38);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar1 = (config_file->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + config_file->_M_string_length);
      FileError::Missing(__return_storage_ptr__,&local_88);
      __cxa_throw(__return_storage_ptr__,&FileError::typeinfo,Error::~Error);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}